

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.h
# Opt level: O2

void Assimp::BaseImporter::CopyVector<aiMesh*>
               (vector<aiMesh_*,_std::allocator<aiMesh_*>_> *vec,aiMesh ***out,uint *outLength)

{
  uint uVar1;
  aiMesh **__first2;
  ulong uVar2;
  
  uVar2 = (long)(vec->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(vec->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
  uVar1 = (uint)(uVar2 >> 3);
  *outLength = uVar1;
  if (uVar1 != 0) {
    __first2 = (aiMesh **)operator_new__(uVar2 & 0x7fffffff8);
    *out = __first2;
    std::
    swap_ranges<__gnu_cxx::__normal_iterator<aiMesh**,std::vector<aiMesh*,std::allocator<aiMesh*>>>,aiMesh**>
              ((__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>)
               (vec->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>)
               (vec->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
               super__Vector_impl_data._M_finish,__first2);
    return;
  }
  return;
}

Assistant:

AI_FORCE_INLINE
    static void CopyVector(
        std::vector<T>& vec,
        T*& out,
        unsigned int& outLength)
    {
        outLength = unsigned(vec.size());
        if (outLength) {
            out = new T[outLength];
            std::swap_ranges(vec.begin(), vec.end(), out);
        }
    }